

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstring.c
# Opt level: O2

TString * internshrstr(lua_State *L,char *str,size_t l)

{
  int *piVar1;
  global_State *pgVar2;
  uint h;
  int iVar3;
  TString *pTVar4;
  int iVar5;
  anon_union_8_2_b887aad4_for_u *paVar6;
  anon_union_8_2_b887aad4_for_u *paVar7;
  
  pgVar2 = L->l_G;
  h = luaS_hash(str,l,pgVar2->seed);
  iVar5 = (pgVar2->strt).size;
  paVar6 = (anon_union_8_2_b887aad4_for_u *)((pgVar2->strt).hash + (iVar5 - 1U & h));
  paVar7 = paVar6;
  while( true ) {
    pTVar4 = paVar7->hnext;
    if (pTVar4 == (TString *)0x0) {
      iVar3 = (pgVar2->strt).nuse;
      if (iVar5 <= iVar3) {
        if (iVar3 == 0x7fffffff) {
          luaC_fullgc(L,1);
          if ((pgVar2->strt).nuse == 0x7fffffff) {
            luaD_throw(L,'\x04');
          }
          iVar5 = (pgVar2->strt).size;
        }
        if (iVar5 < 0x40000000) {
          luaS_resize(L,iVar5 * 2);
          iVar5 = (pgVar2->strt).size;
        }
        paVar6 = (anon_union_8_2_b887aad4_for_u *)((pgVar2->strt).hash + (iVar5 - 1U & h));
      }
      pTVar4 = createstrobj(L,l + 0x19,'\x04',h);
      pTVar4->shrlen = (ls_byte)l;
      *(undefined1 *)((long)&pTVar4->contents + l) = 0;
      memcpy(&pTVar4->contents,str,l);
      (pTVar4->u).hnext = (TString *)*(TString **)paVar6;
      paVar6->hnext = pTVar4;
      piVar1 = &(pgVar2->strt).nuse;
      *piVar1 = *piVar1 + 1;
      return pTVar4;
    }
    if (((uint)(int)pTVar4->shrlen == l) && (iVar3 = bcmp(str,&pTVar4->contents,l), iVar3 == 0))
    break;
    paVar7 = &pTVar4->u;
  }
  if (((pgVar2->currentwhite ^ 0x18) & pTVar4->marked) == 0) {
    return pTVar4;
  }
  pTVar4->marked = pTVar4->marked ^ 0x18;
  return pTVar4;
}

Assistant:

static TString *internshrstr (lua_State *L, const char *str, size_t l) {
  TString *ts;
  global_State *g = G(L);
  stringtable *tb = &g->strt;
  unsigned int h = luaS_hash(str, l, g->seed);
  TString **list = &tb->hash[lmod(h, tb->size)];
  lua_assert(str != NULL);  /* otherwise 'memcmp'/'memcpy' are undefined */
  for (ts = *list; ts != NULL; ts = ts->u.hnext) {
    if (l == cast_uint(ts->shrlen) &&
        (memcmp(str, getshrstr(ts), l * sizeof(char)) == 0)) {
      /* found! */
      if (isdead(g, ts))  /* dead (but not collected yet)? */
        changewhite(ts);  /* resurrect it */
      return ts;
    }
  }
  /* else must create a new string */
  if (tb->nuse >= tb->size) {  /* need to grow string table? */
    growstrtab(L, tb);
    list = &tb->hash[lmod(h, tb->size)];  /* rehash with new size */
  }
  ts = createstrobj(L, sizestrshr(l), LUA_VSHRSTR, h);
  ts->shrlen = cast(ls_byte, l);
  getshrstr(ts)[l] = '\0';  /* ending 0 */
  memcpy(getshrstr(ts), str, l * sizeof(char));
  ts->u.hnext = *list;
  *list = ts;
  tb->nuse++;
  return ts;
}